

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::FboTestUtil::TextureCubeArrayShader::shadeVertices
          (TextureCubeArrayShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  const_reference pvVar1;
  float fVar2;
  float fVar3;
  float z_;
  VecAccess<float,_4,_2> VVar4;
  Vector<float,_4> local_c4;
  undefined8 local_b4;
  undefined8 uStack_ac;
  Vector<float,_3> local_a4;
  undefined1 local_98 [8];
  Vec3 v_coord;
  Vector<float,_4> local_80;
  VecAccess<float,_4,_2> local_70;
  Vector<float,_2> local_60;
  Vec2 a_coord;
  VertexPacket *packet;
  undefined1 local_48 [4];
  int packetNdx;
  Mat3 texCoordMat;
  int numPackets_local;
  VertexPacket **packets_local;
  VertexAttrib *inputs_local;
  TextureCubeArrayShader *this_local;
  
  texCoordMat.m_data.m_data[2].m_data[1] = (float)numPackets;
  unique0x1000026d = packets;
  pvVar1 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                     (&(this->super_ShaderProgram).m_uniforms,0);
  tcu::Matrix<float,_3,_3>::Matrix((Matrix<float,_3,_3> *)local_48,&(pvVar1->value).f);
  for (packet._4_4_ = 0; packet._4_4_ < (int)texCoordMat.m_data.m_data[2].m_data[1];
      packet._4_4_ = packet._4_4_ + 1) {
    a_coord.m_data = *(float (*) [2])(stack0xffffffffffffffe0 + packet._4_4_);
    rr::readVertexAttribFloat
              ((rr *)&local_80,inputs + 1,*(int *)a_coord.m_data,*(int *)((long)a_coord.m_data + 4))
    ;
    VVar4 = tcu::Vector<float,_4>::xy(&local_80);
    local_70 = VVar4;
    tcu::VecAccess::operator_cast_to_Vector((VecAccess *)&local_60);
    fVar2 = tcu::Vector<float,_2>::x(&local_60);
    fVar3 = tcu::Vector<float,_2>::y(&local_60);
    tcu::Vector<float,_3>::Vector(&local_a4,fVar2,fVar3,1.0);
    tcu::operator*((tcu *)local_98,(Matrix<float,_3,_3> *)local_48,&local_a4);
    rr::readVertexAttribFloat
              ((rr *)&local_b4,inputs,*(int *)a_coord.m_data,*(int *)((long)a_coord.m_data + 4));
    *(undefined8 *)((long)a_coord.m_data + 8) = local_b4;
    *(undefined8 *)((long)a_coord.m_data + 0x10) = uStack_ac;
    fVar2 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_98);
    fVar3 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_98);
    z_ = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_98);
    tcu::Vector<float,_4>::Vector(&local_c4,fVar2,fVar3,z_,0.0);
    rr::GenericVec4::operator=((GenericVec4 *)((long)a_coord.m_data + 0x20),&local_c4);
  }
  tcu::Matrix<float,_3,_3>::~Matrix((Matrix<float,_3,_3> *)local_48);
  return;
}

Assistant:

void TextureCubeArrayShader::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	tcu::Mat3 texCoordMat = tcu::Mat3(m_uniforms[0].value.m3);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		rr::VertexPacket&	packet	= *packets[packetNdx];
		const tcu::Vec2		a_coord = rr::readVertexAttribFloat(inputs[1], packet.instanceNdx, packet.vertexNdx).xy();
		const tcu::Vec3		v_coord = texCoordMat * tcu::Vec3(a_coord.x(), a_coord.y(), 1.0f);

		packet.position = rr::readVertexAttribFloat(inputs[0], packet.instanceNdx, packet.vertexNdx);
		packet.outputs[0] = tcu::Vec4(v_coord.x(), v_coord.y(), v_coord.z(), 0.0f);
	}
}